

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>::
insert<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry,capnp::_::RawSchema_const*&>
          (HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>
           *this,ArrayPtr<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry>
                 table,size_t pos,RawSchema **params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  uint uVar3;
  HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>
  *this_00;
  HashBucket *pHVar4;
  uint uVar5;
  size_t sVar6;
  long *in_R9;
  HashBucket *pHVar7;
  Maybe<unsigned_long> MVar8;
  
  this_00 = (HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>
             *)table.ptr;
  if ((this_00->buckets).size_ * 2 < (this_00->erasedCount + pos) * 3 + 3) {
    HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>::
    rehash(this_00,pos * 3 + 3);
  }
  uVar3 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,(RawSchema *)*in_R9);
  aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).size_;
  uVar5 = (int)aVar2.value - 1U & uVar3;
  pHVar4 = (HashBucket *)0x0;
  do {
    pHVar7 = (this_00->buckets).ptr + uVar5;
    uVar1 = pHVar7->value;
    if (uVar1 == 1) {
      if (pHVar4 == (HashBucket *)0x0) {
        pHVar4 = pHVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar4 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar7 = pHVar4;
        }
        *pHVar7 = (HashBucket)(((ulong)uVar3 | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>
                 )0x0;
        goto LAB_0014a788;
      }
      if ((pHVar7->hash == uVar3) && (*(long *)(table.size_ + (ulong)(uVar1 - 2) * 0x10) == *in_R9))
      {
        *this = (HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_0014a788:
        MVar8.ptr.field_1.value = aVar2.value;
        MVar8.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar8.ptr;
      }
    }
    sVar6 = (ulong)uVar5 + 1;
    uVar5 = (uint)sVar6;
    if (sVar6 == aVar2.value) {
      uVar5 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }